

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2.c
# Opt level: O1

MPP_RET iep2_init(IepCtx *ictx)

{
  undefined8 *puVar1;
  int iVar2;
  RockchipSocType RVar3;
  MPP_RET MVar4;
  char *fname;
  char *fmt;
  RK_U32 client_data;
  MppReqV1 mpp_req;
  undefined4 local_3c;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 *local_28;
  
  puVar1 = (undefined8 *)*ictx;
  local_3c = 0x1c;
  mpp_env_get_u32("iep_debug",&iep_debug,0);
  iVar2 = open("/dev/mpp_service",0x80002);
  *(int *)((long)puVar1 + 0x4f4) = iVar2;
  if (iVar2 < 0) {
    fmt = "can NOT find device /dev/iep2\n";
  }
  else {
    local_38 = 0x100;
    local_30 = 4;
    local_28 = &local_3c;
    iVar2 = ioctl(iVar2,0x40047601);
    if (iVar2 == 0) {
      *puVar1 = 3;
      puVar1[1] = 3;
      puVar1[3] = 0xb4000000b4;
      *(undefined4 *)(puVar1 + 4) = 0xb4;
      puVar1[2] = 0x780000002d;
      puVar1[0xd] = 5;
      puVar1[0xe] = 0x100000000;
      *(undefined4 *)(puVar1 + 0xf) = 6;
      RVar3 = mpp_get_soc_type();
      if ((RVar3 == ROCKCHIP_SOC_RK3528) &&
         (mpp_env_get_u32("iep_md_pre_en",&iep_md_pre_en,0), iep_md_pre_en == 0)) {
        *(undefined4 *)((long)puVar1 + 0x7c) = 8;
      }
      else {
        *(undefined4 *)((long)puVar1 + 0x7c) = 4;
      }
      puVar1[0x10] = 0x1e;
      puVar1[0x11] = 0x3c0000003c;
      puVar1[0x12] = 0;
      puVar1[0x14] = 0x1400000002;
      puVar1[0x25] = 0xa00000005;
      puVar1[0x26] = 0x400000004;
      puVar1[0x27] = 0x1c00000014;
      *(undefined4 *)(puVar1 + 0x28) = 0x1b;
      *(undefined8 *)((long)puVar1 + 0x16c) = 0x10000000c;
      puVar1[0x30] = 0x101010101010101;
      puVar1[0x31] = 0x101010101010101;
      puVar1[0x32] = 0x101010101010101;
      puVar1[0x33] = 0x101010101010101;
      puVar1[0x2f] = 0x400000010;
      *(undefined4 *)((long)puVar1 + 0x174) = 0;
      *(undefined4 *)(puVar1 + 0x34) = 1;
      ((RK_U32 *)((long)puVar1 + 0x1a4))[0] = 0;
      ((RK_U32 *)((long)puVar1 + 0x1a4))[1] = 0;
      ((RK_U32 *)((long)puVar1 + 0x1ac))[0] = 0;
      ((RK_U32 *)((long)puVar1 + 0x1ac))[1] = 0;
      ((RK_U32 *)((long)puVar1 + 0x1b4))[0] = 0x1010000;
      ((RK_U32 *)((long)puVar1 + 0x1b4))[1] = 0x6050302;
      ((RK_U32 *)((long)puVar1 + 0x1bc))[0] = 0xf0d0a08;
      ((RK_U32 *)((long)puVar1 + 0x1bc))[1] = 0x1c191512;
      ((RK_U32 *)((long)puVar1 + 0x1c4))[0] = 0x2b282420;
      ((RK_U32 *)((long)puVar1 + 0x1c4))[1] = 0x3634312e;
      ((RK_U32 *)((long)puVar1 + 0x1cc))[0] = 0x3d3c3a38;
      ((RK_U32 *)((long)puVar1 + 0x1cc))[1] = 0x40403f3e;
      ((RK_U32 *)((long)puVar1 + 0x1d4))[0] = 0x40404040;
      ((RK_U32 *)((long)puVar1 + 0x1d4))[1] = 0x40404040;
      ((RK_U32 *)((long)puVar1 + 0x1dc))[0] = 0x40404040;
      ((RK_U32 *)((long)puVar1 + 0x1dc))[1] = 0x40404040;
      puVar1[0x3d] = 0;
      *(undefined4 *)(puVar1 + 0xd) = 5;
      *puVar1 = 3;
      puVar1[1] = 3;
      puVar1[3] = 0xb4000000b4;
      *(undefined4 *)(puVar1 + 4) = 0xb4;
      puVar1[2] = 0x780000002d;
      memset((void *)((long)puVar1 + 0x42c),0,0xa8);
      *(undefined8 *)((long)puVar1 + 0x4cc) = 0xffffffff00000004;
      MVar4 = mpp_buffer_group_get
                        ((MppBufferGroup *)(puVar1 + 0x9b),MPP_BUFFER_TYPE_DRM,MPP_BUFFER_INTERNAL,
                         (char *)0x0,"iep2_init");
      if (MVar4 != MPP_OK) {
        close(*(int *)((long)puVar1 + 0x4f4));
        _mpp_log_l(2,(char *)0x0,"memGroup mpp_buffer_group_get failed\n",(char *)0x0);
        return MVar4;
      }
      MVar4 = mpp_buffer_get_with_tag
                        ((MppBufferGroup)puVar1[0x9b],(MppBuffer *)(puVar1 + 0x9c),0xe100,
                         (char *)0x0,"iep2_init");
      if (MVar4 == MPP_OK) {
        MVar4 = mpp_buffer_get_with_tag
                          ((MppBufferGroup)puVar1[0x9b],(MppBuffer *)(puVar1 + 0x9d),0x1fe000,
                           (char *)0x0,"iep2_init");
        if (MVar4 == MPP_OK) {
          iVar2 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar1[0x9c],"iep2_init");
          *(int *)(puVar1 + 0xc) = iVar2;
          iVar2 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar1[0x9d],"iep2_init");
          *(int *)((long)puVar1 + 100) = iVar2;
          return MPP_OK;
        }
        close(*(int *)((long)puVar1 + 0x4f4));
        mpp_buffer_group_put((MppBufferGroup)puVar1[0x9b]);
        mpp_buffer_put_with_caller((MppBuffer)puVar1[0x9c],"iep2_init");
        fmt = "allocate md buffer failed\n";
        fname = "iep2_init";
      }
      else {
        close(*(int *)((long)puVar1 + 0x4f4));
        mpp_buffer_group_put((MppBufferGroup)puVar1[0x9b]);
        fmt = "allocate mv buffer failed\n";
        fname = "iep2_init";
      }
      goto LAB_0017ccd2;
    }
    fmt = "ioctl set_client failed\n";
  }
  fname = (char *)0x0;
LAB_0017ccd2:
  _mpp_log_l(2,(char *)0x0,fmt,fname);
  return MPP_NOK;
}

Assistant:

static MPP_RET iep2_init(IepCtx *ictx)
{
    MPP_RET ret;
    struct iep2_api_ctx *ctx = *ictx;
    MppReqV1 mpp_req;
    RK_U32 client_data = IEP_CLIENT_TYPE;

    mpp_env_get_u32("iep_debug", &iep_debug, 0);

    ctx->fd = open("/dev/mpp_service", O_RDWR | O_CLOEXEC);
    if (ctx->fd < 0) {
        mpp_err("can NOT find device /dev/iep2\n");
        return MPP_NOK;
    }

    mpp_req.cmd = MPP_CMD_INIT_CLIENT_TYPE;
    mpp_req.flag = 0;
    mpp_req.size = sizeof(client_data);
    mpp_req.data_ptr = REQ_DATA_PTR(&client_data);

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req);
    if (ret) {
        mpp_err("ioctl set_client failed\n");
        return MPP_NOK;
    }

    // set default parameters.
    ctx->params.src_fmt = IEP2_FMT_YUV420;
    ctx->params.src_yuv_swap = IEP2_YUV_SWAP_SP_UV;
    ctx->params.dst_fmt = IEP2_FMT_YUV420;
    ctx->params.dst_yuv_swap = IEP2_YUV_SWAP_SP_UV;

    ctx->params.src_y_stride = 720 / 4;
    ctx->params.src_uv_stride = 720 / 4;
    ctx->params.dst_y_stride = 720 / 4;

    ctx->params.tile_cols = 720 / 16;
    ctx->params.tile_rows = 480 / 4;

    ctx->params.dil_mode = IEP2_DIL_MODE_I1O1T;

    ctx->params.dil_out_mode = IEP2_OUT_MODE_LINE;
    ctx->params.dil_field_order = IEP2_FIELD_ORDER_TFF;

    ctx->params.md_theta = 1;
    ctx->params.md_r = 6;

    if (mpp_get_soc_type() == ROCKCHIP_SOC_RK3528) {
        mpp_env_get_u32("iep_md_pre_en", &iep_md_pre_en, 0);
        if (iep_md_pre_en) {
            ctx->params.md_lambda = 4;
        } else {
            ctx->params.md_lambda = 8;
        }
    } else {
        ctx->params.md_lambda = 4;
    }

    ctx->params.dect_resi_thr = 30;
    ctx->params.osd_area_num = 0;
    ctx->params.osd_gradh_thr = 60;
    ctx->params.osd_gradv_thr = 60;

    ctx->params.osd_pos_limit_en = 0;
    ctx->params.osd_pos_limit_num = 0;

    ctx->params.osd_pec_thr = 20;
    ctx->params.osd_line_num = 2;

    ctx->params.me_pena = 5;
    ctx->params.mv_similar_thr = 4;
    ctx->params.mv_similar_num_thr0 = 4;
    ctx->params.mv_bonus = 10;
    ctx->params.me_thr_offset = 20;

    ctx->params.mv_left_limit = 28;
    ctx->params.mv_right_limit = 27;

    ctx->params.eedi_thr0 = 12;

    memset(ctx->params.comb_osd_vld, 1, sizeof(ctx->params.comb_osd_vld));
    ctx->params.comb_t_thr = 4;
    ctx->params.comb_feature_thr = 16;
    ctx->params.comb_cnt_thr = 0;

    ctx->params.ble_backtoma_num = 1;

    ctx->params.mtn_en = 1;
    memcpy(ctx->params.mtn_tab, iep2_mtn_tab, sizeof(ctx->params.mtn_tab));

    ctx->params.roi_en = 0;
    ctx->params.roi_layer_num = 0;

    ctx->params.dil_mode = IEP2_DIL_MODE_I1O1T;
    ctx->params.src_fmt = IEP2_FMT_YUV420;
    ctx->params.src_yuv_swap = IEP2_YUV_SWAP_SP_UV;
    ctx->params.dst_fmt = IEP2_FMT_YUV420;
    ctx->params.dst_yuv_swap = IEP2_YUV_SWAP_SP_UV;
    ctx->params.src_y_stride = 720 / 4;
    ctx->params.src_uv_stride = 720 / 4;
    ctx->params.dst_y_stride = 720 / 4;
    ctx->params.tile_cols = 720 / 16;
    ctx->params.tile_rows = 480 / 4;

    memset(&ctx->ff_inf, 0, sizeof(ctx->ff_inf));

    memset(&ctx->pd_inf, 0, sizeof(ctx->pd_inf));
    ctx->pd_inf.pdtype = PD_TYPES_UNKNOWN;
    ctx->pd_inf.step = -1;

    ret = mpp_buffer_group_get_internal(&ctx->memGroup, MPP_BUFFER_TYPE_DRM);
    if (MPP_OK != ret) {
        close(ctx->fd);
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        return ret;
    }

    ret = mpp_buffer_get(ctx->memGroup, &ctx->mv_buf,
                         IEP2_TILE_W_MAX * IEP2_TILE_H_MAX);
    if (ret) {
        close(ctx->fd);
        mpp_buffer_group_put(ctx->memGroup);
        mpp_err_f("allocate mv buffer failed\n");
        return MPP_NOK;
    }

    ret = mpp_buffer_get(ctx->memGroup, &ctx->md_buf, 1920 * 1088);
    if (ret) {
        close(ctx->fd);
        mpp_buffer_group_put(ctx->memGroup);
        mpp_buffer_put(ctx->mv_buf);
        mpp_err_f("allocate md buffer failed\n");
        return MPP_NOK;
    }

    ctx->params.mv_addr = mpp_buffer_get_fd(ctx->mv_buf);
    ctx->params.md_addr = mpp_buffer_get_fd(ctx->md_buf);

    return MPP_OK;
}